

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

void clearBits(quint8 *where,int start,int end)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  quint8 bytemask;
  
  if (in_ESI != in_EDX) {
    *(byte *)(in_RDI + in_ESI / 8) =
         *(byte *)(in_RDI + in_ESI / 8) & -(char)(1 << (8 - ((byte)in_ESI & 7) & 0x1f));
    memset((void *)(in_RDI + (in_ESI + 7) / 8),0,(long)(in_EDX / 8 - (in_ESI + 7) / 8));
  }
  return;
}

Assistant:

static void clearBits(quint8 *where, int start, int end)
{
    Q_ASSERT(end == 32 || end == 128);
    if (start == end)
        return;

    // for the byte where 'start' is, clear the lower bits only
    quint8 bytemask = 256 - (1 << (8 - (start & 7)));
    where[start / 8] &= bytemask;

    // for the tail part, clear everything
    memset(where + (start + 7) / 8, 0, end / 8 - (start + 7) / 8);
}